

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

void amqp_messenger_destroy_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "invalid argument (name=%p, value=%p)";
    iVar1 = 0x3e1;
  }
  else {
    iVar1 = strcmp("amqp_message_queue_options",name);
    if (iVar1 == 0) {
      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar3 = "invalid argument (option \'%s\' is not suppported)";
    iVar1 = 0x3e9;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
            ,"amqp_messenger_destroy_option",iVar1,1,pcVar3,name);
  return;
}

Assistant:

static void amqp_messenger_destroy_option(const char* name, const void* value)
{
    if (name == NULL || value == NULL)
    {
        LogError("invalid argument (name=%p, value=%p)", name, value);
    }
    else if (strcmp(MESSENGER_SAVED_MQ_OPTIONS, name) == 0)
    {
        OptionHandler_Destroy((OPTIONHANDLER_HANDLE)value);
    }
    else
    {
        LogError("invalid argument (option '%s' is not suppported)", name);
    }
}